

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B3DImporter.cpp
# Opt level: O1

void __thiscall Assimp::B3DImporter::ReadBRUS(B3DImporter *this)

{
  pointer pbVar1;
  ulong uVar2;
  _Head_base<0UL,_aiMaterial_*,_false> _Var3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  aiMaterial *this_00;
  B3DImporter *pBVar7;
  size_t sVar8;
  unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_> mat;
  float specpow;
  float alpha;
  aiColor3D speccolor;
  string name;
  int i;
  aiString ainame;
  _Head_base<0UL,_aiMaterial_*,_false> local_8f8;
  float local_8ec;
  float local_8e8;
  float local_8e4;
  float local_8e0;
  float local_8dc;
  float local_8d8;
  vector<std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>,std::allocator<std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>>>
  *local_8c0;
  undefined8 local_8b8;
  float local_8b0;
  string local_8a8;
  float local_888;
  undefined1 local_878 [32];
  undefined1 local_858 [36];
  undefined1 local_834 [1024];
  aiString local_434;
  
  uVar4 = ReadInt(this);
  if (8 < uVar4) {
    local_858._0_8_ = local_858 + 0x10;
    pBVar7 = (B3DImporter *)local_858;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_858,"Bad texture count","");
    Fail(pBVar7,(string *)local_858);
  }
  if ((this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish[-1] != this->_pos) {
    local_8c0 = (vector<std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>,std::allocator<std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>>>
                 *)&this->_materials;
    do {
      ReadString_abi_cxx11_(&local_8a8,this);
      local_8d8 = ReadFloat(this);
      local_888 = ReadFloat(this);
      local_8b0 = ReadFloat(this);
      local_8b8 = CONCAT44(local_888,local_8d8);
      local_8e8 = ReadFloat(this);
      local_8d8 = ReadFloat(this);
      ReadInt(this);
      uVar5 = ReadInt(this);
      this_00 = (aiMaterial *)operator_new(0x10);
      aiMaterial::aiMaterial(this_00);
      sVar8 = local_8a8._M_string_length & 0xffffffff;
      if ((local_8a8._M_string_length & 0xfffffc00) != 0) {
        sVar8 = 0x3ff;
      }
      local_434.length = (ai_uint32)sVar8;
      local_8f8._M_head_impl = this_00;
      memcpy(local_434.data,local_8a8._M_dataplus._M_p,sVar8);
      local_434.data[sVar8] = '\0';
      aiMaterial::AddProperty(this_00,&local_434,"?mat.name",0,0);
      aiMaterial::AddBinaryProperty
                (local_8f8._M_head_impl,&local_8b8,0xc,"$clr.diffuse",0,0,aiPTI_Float);
      aiMaterial::AddBinaryProperty
                (local_8f8._M_head_impl,&local_8e8,4,"$mat.opacity",0,0,aiPTI_Float);
      local_8e4 = local_8d8;
      local_8e0 = local_8d8;
      local_8dc = local_8d8;
      aiMaterial::AddBinaryProperty
                (local_8f8._M_head_impl,&local_8e4,0xc,"$clr.specular",0,0,aiPTI_Float);
      local_8ec = local_8d8 * 128.0;
      aiMaterial::AddBinaryProperty
                (local_8f8._M_head_impl,&local_8ec,4,"$mat.shininess",0,0,aiPTI_Float);
      if ((uVar5 & 0x10) != 0) {
        local_858._32_4_ = 1;
        aiMaterial::AddBinaryProperty
                  (local_8f8._M_head_impl,local_858 + 0x20,4,"$mat.twosided",0,0,aiPTI_Integer);
      }
      if (uVar4 != 0) {
        uVar5 = 0;
        do {
          uVar6 = ReadInt(this);
          if (((int)uVar6 < -1) ||
             ((-1 < (int)uVar6 &&
              ((int)((ulong)((long)(this->_textures).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->_textures).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 5) <= (int)uVar6))))
          {
            local_878._0_8_ = local_878 + 0x10;
            pBVar7 = (B3DImporter *)local_878;
            std::__cxx11::string::_M_construct<char_const*>((string *)pBVar7,"Bad texture id","");
            Fail(pBVar7,(string *)local_878);
          }
          if (uVar5 == 0 && -1 < (int)uVar6) {
            pbVar1 = (this->_textures).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar2 = pbVar1[uVar6]._M_string_length;
            sVar8 = uVar2 & 0xffffffff;
            if ((uVar2 & 0xfffffc00) != 0) {
              sVar8 = 0x3ff;
            }
            local_858._32_4_ = (undefined4)sVar8;
            memcpy(local_834,pbVar1[uVar6]._M_dataplus._M_p,sVar8);
            local_834[sVar8] = 0;
            aiMaterial::AddProperty
                      (local_8f8._M_head_impl,(aiString *)(local_858 + 0x20),"$tex.file",1,0);
          }
          uVar5 = uVar5 + 1;
        } while (uVar4 != uVar5);
      }
      std::
      vector<std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>,std::allocator<std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>>>
      ::emplace_back<std::unique_ptr<aiMaterial,std::default_delete<aiMaterial>>>
                (local_8c0,(unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_> *)&local_8f8);
      _Var3._M_head_impl = local_8f8._M_head_impl;
      if (local_8f8._M_head_impl != (aiMaterial *)0x0) {
        aiMaterial::~aiMaterial(local_8f8._M_head_impl);
        operator_delete(_Var3._M_head_impl);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8a8._M_dataplus._M_p != &local_8a8.field_2) {
        operator_delete(local_8a8._M_dataplus._M_p);
      }
    } while ((this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish[-1] != this->_pos);
  }
  return;
}

Assistant:

void B3DImporter::ReadBRUS(){
    int n_texs=ReadInt();
    if( n_texs<0 || n_texs>8 ){
        Fail( "Bad texture count" );
    }
    while( ChunkSize() ){
        string name=ReadString();
        aiVector3D color=ReadVec3();
        float alpha=ReadFloat();
        float shiny=ReadFloat();
        /*int blend=**/ReadInt();
        int fx=ReadInt();

        std::unique_ptr<aiMaterial> mat(new aiMaterial);

        // Name
        aiString ainame( name );
        mat->AddProperty( &ainame,AI_MATKEY_NAME );

        // Diffuse color
        mat->AddProperty( &color,1,AI_MATKEY_COLOR_DIFFUSE );

        // Opacity
        mat->AddProperty( &alpha,1,AI_MATKEY_OPACITY );

        // Specular color
        aiColor3D speccolor( shiny,shiny,shiny );
        mat->AddProperty( &speccolor,1,AI_MATKEY_COLOR_SPECULAR );

        // Specular power
        float specpow=shiny*128;
        mat->AddProperty( &specpow,1,AI_MATKEY_SHININESS );

        // Double sided
        if( fx & 0x10 ){
            int i=1;
            mat->AddProperty( &i,1,AI_MATKEY_TWOSIDED );
        }

        //Textures
        for( int i=0;i<n_texs;++i ){
            int texid=ReadInt();
            if( texid<-1 || (texid>=0 && texid>=static_cast<int>(_textures.size())) ){
                Fail( "Bad texture id" );
            }
            if( i==0 && texid>=0 ){
                aiString texname( _textures[texid] );
                mat->AddProperty( &texname,AI_MATKEY_TEXTURE_DIFFUSE(0) );
            }
        }
        _materials.emplace_back( std::move(mat) );
    }
}